

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,FloatRegisters dest,Registers srcMemReg,int offset)

{
  undefined3 in_register_00000011;
  Registers *__args;
  size_t i;
  long lVar1;
  IntToBytes converter;
  Registers local_2d;
  Registers local_2c;
  uchar local_2b [3];
  Registers local_28;
  uchar local_27 [3];
  int local_24;
  
  if (CONCAT31(in_register_00000011,srcMemReg) == 4) {
    local_2b[2] = 0xf3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_2b + 2);
    local_2b[1] = 0xf;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_2b + 1);
    local_2b[0] = '\x10';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_2b);
    local_2c = dest << 3 | 0x84;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,&local_2c);
    __args = &local_2d;
    local_2d = 0x24;
  }
  else {
    local_27[2] = 0xf3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_27 + 2);
    local_27[1] = 0xf;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_27 + 1);
    local_27[0] = '\x10';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_27);
    local_28 = dest << 3 | srcMemReg | 0x80;
    __args = &local_28;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,__args);
  local_24 = offset;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,(value_type_conflict2 *)((long)&local_24 + lVar1));
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, FloatRegisters dest, Registers srcMemReg, int offset) {
		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0xf3);
			codeGen.push_back(0x0f);
			codeGen.push_back(0x10);
			codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));
		} else {
			codeGen.push_back(0xf3);
			codeGen.push_back(0x0f);
			codeGen.push_back(0x10);
			codeGen.push_back(0x84 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
		}

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}